

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

Node * __thiscall llvm::yaml::KeyValueNode::getKey(KeyValueNode *this)

{
  BumpPtrAllocator *pBVar1;
  KeyValueNode *pKVar2;
  Token *pTVar3;
  KeyValueNode *local_80;
  KeyValueNode *local_70;
  Token *t;
  Token *local_20;
  Token *t_1;
  KeyValueNode *this_local;
  
  if (this->Key == (Node *)0x0) {
    t_1 = (Token *)this;
    local_20 = Node::peekNext(&this->super_Node);
    if (((local_20->Kind == TK_BlockEnd) || (local_20->Kind == TK_Value)) ||
       (local_20->Kind == TK_Error)) {
      pBVar1 = Node::getAllocator(&this->super_Node);
      pKVar2 = (KeyValueNode *)Node::operator_new(0x48,pBVar1,0x10);
      local_70 = (KeyValueNode *)0x0;
      if (pKVar2 != (KeyValueNode *)0x0) {
        NullNode::NullNode((NullNode *)pKVar2,(this->super_Node).Doc);
        local_70 = pKVar2;
      }
      this->Key = &local_70->super_Node;
      this_local = local_70;
    }
    else {
      if (local_20->Kind == TK_Key) {
        Node::getNext((Token *)&t,&this->super_Node);
        Token::~Token((Token *)&t);
      }
      pTVar3 = Node::peekNext(&this->super_Node);
      if ((pTVar3->Kind == TK_BlockEnd) || (pTVar3->Kind == TK_Value)) {
        pBVar1 = Node::getAllocator(&this->super_Node);
        pKVar2 = (KeyValueNode *)Node::operator_new(0x48,pBVar1,0x10);
        local_80 = (KeyValueNode *)0x0;
        if (pKVar2 != (KeyValueNode *)0x0) {
          NullNode::NullNode((NullNode *)pKVar2,(this->super_Node).Doc);
          local_80 = pKVar2;
        }
        this->Key = &local_80->super_Node;
        this_local = local_80;
      }
      else {
        this_local = (KeyValueNode *)Node::parseBlockNode(&this->super_Node);
        this->Key = (Node *)this_local;
      }
    }
  }
  else {
    this_local = (KeyValueNode *)this->Key;
  }
  return &this_local->super_Node;
}

Assistant:

Node *KeyValueNode::getKey() {
  if (Key)
    return Key;
  // Handle implicit null keys.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_Value
        || t.Kind == Token::TK_Error) {
      return Key = new (getAllocator()) NullNode(Doc);
    }
    if (t.Kind == Token::TK_Key)
      getNext(); // skip TK_Key.
  }

  // Handle explicit null keys.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Value) {
    return Key = new (getAllocator()) NullNode(Doc);
  }

  // We've got a normal key.
  return Key = parseBlockNode();
}